

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O0

void nn_chunkref_trim(nn_chunkref *self,size_t n)

{
  void *pvVar1;
  ulong in_RSI;
  byte *in_RDI;
  nn_chunkref_chunk *ch;
  
  if (*in_RDI == 0xff) {
    pvVar1 = nn_chunk_trim(ch,(size_t)in_RDI);
    *(void **)(in_RDI + 8) = pvVar1;
  }
  else {
    if (*in_RDI < in_RSI) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->u.ref [0] >= n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/chunkref.c"
              ,0x89);
      fflush(_stderr);
      nn_err_abort();
    }
    memmove(in_RDI + 1,in_RDI + in_RSI + 1,*in_RDI - in_RSI);
    *in_RDI = *in_RDI - (char)in_RSI;
  }
  return;
}

Assistant:

void nn_chunkref_trim (struct nn_chunkref *self, size_t n)
{
    struct nn_chunkref_chunk *ch;

    if (self->u.ref [0] == 0xff) {
        ch = (struct nn_chunkref_chunk*) self;
        ch->chunk = nn_chunk_trim (ch->chunk, n);
        return;
    }

    nn_assert (self->u.ref [0] >= n);
    memmove (&self->u.ref [1], &self->u.ref [1 + n], self->u.ref [0] - n);
    self->u.ref [0] -= (uint8_t) n;
}